

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O0

string * __thiscall
CJSON::ParseNull_abi_cxx11_(string *__return_storage_ptr__,CJSON *this,char **beg,char **end)

{
  bool bVar1;
  CJSONException *this_00;
  allocator<char> local_61;
  string local_60;
  undefined1 local_29;
  char **local_28;
  char **end_local;
  char **beg_local;
  CJSON *this_local;
  string *Ret;
  
  local_29 = 0;
  local_28 = end;
  end_local = beg;
  beg_local = (char **)this;
  this_local = (CJSON *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while ((((*end_local != *local_28 && (**end_local != ',')) && (**end_local != '}')) &&
         (**end_local != ']'))) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,**end_local);
    *end_local = *end_local + 1;
  }
  *end_local = *end_local + -1;
  bVar1 = std::operator!=(__return_storage_ptr__,"null");
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  this_00 = (CJSONException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Expected null",&local_61);
  CJSONException::CJSONException(this_00,&local_60,EXPECTED_NULL);
  __cxa_throw(this_00,&CJSONException::typeinfo,CJSONException::~CJSONException);
}

Assistant:

inline std::string ParseNull(const char *&beg, const char *&end)
        {
            std::string Ret;

            while (beg != end)
            {
                if(*beg == ',' || *beg == '}' || *beg == ']')
                    break;

                Ret += *beg;

                beg++;
            } 

            beg--;

            if(Ret != "null")
                throw CJSONException("Expected null", JSONErrorType::EXPECTED_NULL);

            return Ret;
        }